

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O3

void aom_blend_a64_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,int subw,int subh
               )

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar29 [16];
  undefined1 auVar33 [32];
  undefined1 auVar43 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  auVar43 = _DAT_00513e40;
  if (((h | w) & 3U) == 0) {
    if ((subh & subw) == 0) {
      if (subw == 0) {
        if (subh == 0) {
          uVar1 = (ulong)src0_stride;
          uVar2 = (ulong)src1_stride;
          if (w == 4) {
            auVar43[8] = 0x40;
            auVar43._0_8_ = 0x4040404040404040;
            auVar43[9] = 0x40;
            auVar43[10] = 0x40;
            auVar43[0xb] = 0x40;
            auVar43[0xc] = 0x40;
            auVar43[0xd] = 0x40;
            auVar43[0xe] = 0x40;
            auVar43[0xf] = 0x40;
            auVar25._8_2_ = 0x200;
            auVar25._0_8_ = 0x200020002000200;
            auVar25._10_2_ = 0x200;
            auVar25._12_2_ = 0x200;
            auVar25._14_2_ = 0x200;
            do {
              auVar49 = vpsubb_avx(auVar43,ZEXT416(*(uint *)mask));
              auVar24 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
              auVar49 = vpunpcklbw_avx(ZEXT416(*(uint *)mask),auVar49);
              auVar49 = vpmaddubsw_avx(auVar24,auVar49);
              auVar49 = vpmulhrsw_avx(auVar49,auVar25);
              auVar49 = vpackuswb_avx(auVar49,auVar49);
              *(int *)dst = auVar49._0_4_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar1);
              src1 = (uint8_t *)((long)src1 + uVar2);
              mask = (uint8_t *)((long)mask + (ulong)mask_stride);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 8) {
            auVar49[8] = 0x40;
            auVar49._0_8_ = 0x4040404040404040;
            auVar49[9] = 0x40;
            auVar49[10] = 0x40;
            auVar49[0xb] = 0x40;
            auVar49[0xc] = 0x40;
            auVar49[0xd] = 0x40;
            auVar49[0xe] = 0x40;
            auVar49[0xf] = 0x40;
            auVar24._8_2_ = 0x200;
            auVar24._0_8_ = 0x200020002000200;
            auVar24._10_2_ = 0x200;
            auVar24._12_2_ = 0x200;
            auVar24._14_2_ = 0x200;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)mask;
              auVar43 = vpsubb_avx(auVar49,auVar30);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)src0;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)src1;
              auVar25 = vpunpcklbw_avx(auVar46,auVar53);
              auVar43 = vpunpcklbw_avx(auVar30,auVar43);
              auVar43 = vpmaddubsw_avx(auVar25,auVar43);
              auVar43 = vpmulhrsw_avx(auVar43,auVar24);
              auVar43 = vpackuswb_avx(auVar43,auVar43);
              *(long *)dst = auVar43._0_8_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar1);
              src1 = (uint8_t *)((long)src1 + uVar2);
              mask = (uint8_t *)((long)mask + (ulong)mask_stride);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar8[8] = 0x40;
            auVar8._0_8_ = 0x4040404040404040;
            auVar8[9] = 0x40;
            auVar8[10] = 0x40;
            auVar8[0xb] = 0x40;
            auVar8[0xc] = 0x40;
            auVar8[0xd] = 0x40;
            auVar8[0xe] = 0x40;
            auVar8[0xf] = 0x40;
            auVar21._8_2_ = 0x200;
            auVar21._0_8_ = 0x200020002000200;
            auVar21._10_2_ = 0x200;
            auVar21._12_2_ = 0x200;
            auVar21._14_2_ = 0x200;
            do {
              auVar43 = *(undefined1 (*) [16])mask;
              auVar49 = vpsubb_avx(auVar8,auVar43);
              auVar25 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar24 = vpunpcklbw_avx(auVar43,auVar49);
              auVar25 = vpmaddubsw_avx(auVar25,auVar24);
              auVar24 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar43 = vpunpckhbw_avx(auVar43,auVar49);
              auVar43 = vpmaddubsw_avx(auVar24,auVar43);
              auVar25 = vpmulhrsw_avx(auVar25,auVar21);
              auVar43 = vpmulhrsw_avx(auVar43,auVar21);
              auVar43 = vpackuswb_avx(auVar25,auVar43);
              *(undefined1 (*) [16])dst = auVar43;
              dst = *(undefined1 (*) [16])dst + dst_stride;
              src0 = *(undefined1 (*) [16])src0 + uVar1;
              src1 = *(undefined1 (*) [16])src1 + uVar2;
              mask = *(undefined1 (*) [16])mask + mask_stride;
              h = h + -1;
            } while (h != 0);
          }
          else {
            auVar47[8] = 0x40;
            auVar47._0_8_ = 0x4040404040404040;
            auVar47[9] = 0x40;
            auVar47[10] = 0x40;
            auVar47[0xb] = 0x40;
            auVar47[0xc] = 0x40;
            auVar47[0xd] = 0x40;
            auVar47[0xe] = 0x40;
            auVar47[0xf] = 0x40;
            auVar47[0x10] = 0x40;
            auVar47[0x11] = 0x40;
            auVar47[0x12] = 0x40;
            auVar47[0x13] = 0x40;
            auVar47[0x14] = 0x40;
            auVar47[0x15] = 0x40;
            auVar47[0x16] = 0x40;
            auVar47[0x17] = 0x40;
            auVar47[0x18] = 0x40;
            auVar47[0x19] = 0x40;
            auVar47[0x1a] = 0x40;
            auVar47[0x1b] = 0x40;
            auVar47[0x1c] = 0x40;
            auVar47[0x1d] = 0x40;
            auVar47[0x1e] = 0x40;
            auVar47[0x1f] = 0x40;
            do {
              if (0 < w) {
                lVar4 = 0;
                do {
                  auVar48 = *(undefined1 (*) [32])(mask + lVar4);
                  auVar32 = vpsubb_avx2(auVar47,auVar48);
                  auVar33 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                            *(undefined1 (*) [32])(src1 + lVar4));
                  auVar31 = vpunpcklbw_avx2(auVar48,auVar32);
                  auVar33 = vpmaddubsw_avx2(auVar33,auVar31);
                  auVar31 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                            *(undefined1 (*) [32])(src1 + lVar4));
                  auVar48 = vpunpckhbw_avx2(auVar48,auVar32);
                  auVar32 = vpmaddubsw_avx2(auVar31,auVar48);
                  auVar48 = vpsrlw_avx2(auVar33,5);
                  auVar48 = vpavgw_avx2(auVar48,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar33 = vpsrlw_avx2(auVar32,5);
                  auVar33 = vpavgw_avx2(auVar33,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar48 = vpackuswb_avx2(auVar48,auVar33);
                  *(undefined1 (*) [32])(dst + lVar4) = auVar48;
                  lVar4 = lVar4 + 0x20;
                } while (lVar4 < w);
              }
              dst = dst + dst_stride;
              src0 = src0 + uVar1;
              src1 = src1 + uVar2;
              mask = mask + mask_stride;
              h = h + -1;
            } while (h != 0);
          }
        }
        else {
          uVar1 = (ulong)src0_stride;
          uVar2 = (ulong)src1_stride;
          uVar3 = (ulong)(mask_stride * 2);
          if (w == 4) {
            auVar10[8] = 0x40;
            auVar10._0_8_ = 0x4040404040404040;
            auVar10[9] = 0x40;
            auVar10[10] = 0x40;
            auVar10[0xb] = 0x40;
            auVar10[0xc] = 0x40;
            auVar10[0xd] = 0x40;
            auVar10[0xe] = 0x40;
            auVar10[0xf] = 0x40;
            auVar23._8_2_ = 0x200;
            auVar23._0_8_ = 0x200020002000200;
            auVar23._10_2_ = 0x200;
            auVar23._12_2_ = 0x200;
            auVar23._14_2_ = 0x200;
            do {
              auVar43 = vpavgb_avx(ZEXT416(*(uint *)mask),
                                   ZEXT416(*(uint *)((long)mask + (ulong)mask_stride)));
              auVar25 = vpsubb_avx(auVar10,auVar43);
              auVar49 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
              auVar43 = vpunpcklbw_avx(auVar43,auVar25);
              auVar43 = vpmaddubsw_avx(auVar49,auVar43);
              auVar43 = vpmulhrsw_avx(auVar43,auVar23);
              auVar43 = vpackuswb_avx(auVar43,auVar43);
              *(int *)dst = auVar43._0_4_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar1);
              src1 = (uint8_t *)((long)src1 + uVar2);
              mask = (uint8_t *)((long)mask + uVar3);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar9._8_2_ = 0x4040;
            auVar9._0_8_ = 0x4040404040404040;
            auVar9._10_2_ = 0x4040;
            auVar9._12_2_ = 0x4040;
            auVar9._14_2_ = 0x4040;
            auVar22._8_2_ = 0x200;
            auVar22._0_8_ = 0x200020002000200;
            auVar22._10_2_ = 0x200;
            auVar22._12_2_ = 0x200;
            auVar22._14_2_ = 0x200;
            do {
              auVar43 = vpavgb_avx(*(undefined1 (*) [16])mask,
                                   *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride))
              ;
              auVar49 = vpsubw_avx(auVar9,auVar43);
              auVar25 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar24 = vpunpcklbw_avx(auVar43,auVar49);
              auVar25 = vpmaddubsw_avx(auVar25,auVar24);
              auVar24 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar43 = vpunpckhbw_avx(auVar43,auVar49);
              auVar43 = vpmaddubsw_avx(auVar24,auVar43);
              auVar25 = vpmulhrsw_avx(auVar25,auVar22);
              auVar43 = vpmulhrsw_avx(auVar43,auVar22);
              auVar43 = vpackuswb_avx(auVar25,auVar43);
              *(undefined1 (*) [16])dst = auVar43;
              dst = *(undefined1 (*) [16])dst + dst_stride;
              src0 = *(undefined1 (*) [16])src0 + uVar1;
              src1 = *(undefined1 (*) [16])src1 + uVar2;
              mask = *(undefined1 (*) [16])mask + uVar3;
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 8) {
            auVar6[8] = 0x40;
            auVar6._0_8_ = 0x4040404040404040;
            auVar6[9] = 0x40;
            auVar6[10] = 0x40;
            auVar6[0xb] = 0x40;
            auVar6[0xc] = 0x40;
            auVar6[0xd] = 0x40;
            auVar6[0xe] = 0x40;
            auVar6[0xf] = 0x40;
            auVar19._8_2_ = 0x200;
            auVar19._0_8_ = 0x200020002000200;
            auVar19._10_2_ = 0x200;
            auVar19._12_2_ = 0x200;
            auVar19._14_2_ = 0x200;
            do {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = *(ulong *)mask;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
              auVar43 = vpavgb_avx(auVar28,auVar36);
              auVar25 = vpsubb_avx(auVar6,auVar43);
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)src0;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)src1;
              auVar49 = vpunpcklbw_avx(auVar44,auVar52);
              auVar43 = vpunpcklbw_avx(auVar43,auVar25);
              auVar43 = vpmaddubsw_avx(auVar49,auVar43);
              auVar43 = vpmulhrsw_avx(auVar43,auVar19);
              auVar43 = vpackuswb_avx(auVar43,auVar43);
              *(long *)dst = auVar43._0_8_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar1);
              src1 = (uint8_t *)((long)src1 + uVar2);
              mask = (uint8_t *)((long)mask + uVar3);
              h = h + -1;
            } while (h != 0);
          }
          else {
            puVar5 = mask + mask_stride;
            auVar48[8] = 0x40;
            auVar48._0_8_ = 0x4040404040404040;
            auVar48[9] = 0x40;
            auVar48[10] = 0x40;
            auVar48[0xb] = 0x40;
            auVar48[0xc] = 0x40;
            auVar48[0xd] = 0x40;
            auVar48[0xe] = 0x40;
            auVar48[0xf] = 0x40;
            auVar48[0x10] = 0x40;
            auVar48[0x11] = 0x40;
            auVar48[0x12] = 0x40;
            auVar48[0x13] = 0x40;
            auVar48[0x14] = 0x40;
            auVar48[0x15] = 0x40;
            auVar48[0x16] = 0x40;
            auVar48[0x17] = 0x40;
            auVar48[0x18] = 0x40;
            auVar48[0x19] = 0x40;
            auVar48[0x1a] = 0x40;
            auVar48[0x1b] = 0x40;
            auVar48[0x1c] = 0x40;
            auVar48[0x1d] = 0x40;
            auVar48[0x1e] = 0x40;
            auVar48[0x1f] = 0x40;
            do {
              if (0 < w) {
                lVar4 = 0;
                do {
                  auVar47 = vpavgb_avx2(*(undefined1 (*) [32])(mask + lVar4),
                                        *(undefined1 (*) [32])(puVar5 + lVar4));
                  auVar32 = vpsubb_avx2(auVar48,auVar47);
                  auVar33 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                            *(undefined1 (*) [32])(src1 + lVar4));
                  auVar31 = vpunpcklbw_avx2(auVar47,auVar32);
                  auVar33 = vpmaddubsw_avx2(auVar33,auVar31);
                  auVar31 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                            *(undefined1 (*) [32])(src1 + lVar4));
                  auVar47 = vpunpckhbw_avx2(auVar47,auVar32);
                  auVar32 = vpmaddubsw_avx2(auVar31,auVar47);
                  auVar47 = vpsrlw_avx2(auVar33,5);
                  auVar47 = vpavgw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar33 = vpsrlw_avx2(auVar32,5);
                  auVar33 = vpavgw_avx2(auVar33,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar47 = vpackuswb_avx2(auVar47,auVar33);
                  *(undefined1 (*) [32])(dst + lVar4) = auVar47;
                  lVar4 = lVar4 + 0x20;
                } while (lVar4 < w);
              }
              dst = dst + dst_stride;
              src0 = src0 + uVar1;
              src1 = src1 + uVar2;
              mask = mask + uVar3;
              puVar5 = puVar5 + uVar3;
              h = h + -1;
            } while (h != 0);
          }
        }
      }
      else {
        uVar1 = (ulong)src0_stride;
        uVar2 = (ulong)src1_stride;
        if (w == 4) {
          auVar7._8_8_ = 0x8080808006040200;
          auVar7._0_8_ = 0x8080808006040200;
          auVar20._8_8_ = 0x8080808007050301;
          auVar20._0_8_ = 0x8080808007050301;
          auVar29[8] = 0x40;
          auVar29._0_8_ = 0x4040404040404040;
          auVar29[9] = 0x40;
          auVar29[10] = 0x40;
          auVar29[0xb] = 0x40;
          auVar29[0xc] = 0x40;
          auVar29[0xd] = 0x40;
          auVar29[0xe] = 0x40;
          auVar29[0xf] = 0x40;
          auVar37._8_2_ = 0x200;
          auVar37._0_8_ = 0x200020002000200;
          auVar37._10_2_ = 0x200;
          auVar37._12_2_ = 0x200;
          auVar37._14_2_ = 0x200;
          do {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)mask;
            auVar43 = vpshufb_avx(auVar45,auVar7);
            auVar25 = vpshufb_avx(auVar45,auVar20);
            auVar43 = vpavgb_avx(auVar43,auVar25);
            auVar25 = vpsubb_avx(auVar29,auVar43);
            auVar49 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
            auVar43 = vpunpcklbw_avx(auVar43,auVar25);
            auVar43 = vpmaddubsw_avx(auVar49,auVar43);
            auVar43 = vpmulhrsw_avx(auVar43,auVar37);
            auVar43 = vpackuswb_avx(auVar43,auVar43);
            *(int *)dst = auVar43._0_4_;
            dst = dst + dst_stride;
            src0 = (uint8_t *)((long)src0 + uVar1);
            src1 = (uint8_t *)((long)src1 + uVar2);
            mask = (uint8_t *)((long)mask + (ulong)mask_stride);
            h = h + -1;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar33._8_2_ = 0xff;
          auVar33._0_8_ = 0xff00ff00ff00ff;
          auVar33._10_2_ = 0xff;
          auVar33._12_2_ = 0xff;
          auVar33._14_2_ = 0xff;
          auVar33._16_2_ = 0xff;
          auVar33._18_2_ = 0xff;
          auVar33._20_2_ = 0xff;
          auVar33._22_2_ = 0xff;
          auVar33._24_2_ = 0xff;
          auVar33._26_2_ = 0xff;
          auVar33._28_2_ = 0xff;
          auVar33._30_2_ = 0xff;
          auVar32[8] = 0x40;
          auVar32._0_8_ = 0x4040404040404040;
          auVar32[9] = 0x40;
          auVar32[10] = 0x40;
          auVar32[0xb] = 0x40;
          auVar32[0xc] = 0x40;
          auVar32[0xd] = 0x40;
          auVar32[0xe] = 0x40;
          auVar32[0xf] = 0x40;
          auVar32[0x10] = 0x40;
          auVar32[0x11] = 0x40;
          auVar32[0x12] = 0x40;
          auVar32[0x13] = 0x40;
          auVar32[0x14] = 0x40;
          auVar32[0x15] = 0x40;
          auVar32[0x16] = 0x40;
          auVar32[0x17] = 0x40;
          auVar32[0x18] = 0x40;
          auVar32[0x19] = 0x40;
          auVar32[0x1a] = 0x40;
          auVar32[0x1b] = 0x40;
          auVar32[0x1c] = 0x40;
          auVar32[0x1d] = 0x40;
          auVar32[0x1e] = 0x40;
          auVar32[0x1f] = 0x40;
          do {
            auVar47 = vpsrlw_avx2(*(undefined1 (*) [32])mask,8);
            auVar47 = vpavgb_avx2(*(undefined1 (*) [32])mask,auVar47);
            auVar47 = vpand_avx2(auVar47,auVar33);
            auVar47 = vpackuswb_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar48 = vpsubb_avx2(auVar32,auVar47);
            auVar43 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
            auVar25 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
            auVar31._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar25;
            auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
            auVar47 = vpunpcklbw_avx2(auVar47,auVar48);
            auVar47 = vpmaddubsw_avx2(auVar31,auVar47);
            auVar47 = vpsrlw_avx2(auVar47,5);
            auVar47 = vpavgw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar43 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
            *(undefined1 (*) [16])dst = auVar43;
            dst = *(undefined1 (*) [16])dst + dst_stride;
            src0 = *(undefined1 (*) [16])src0 + uVar1;
            src1 = *(undefined1 (*) [16])src1 + uVar2;
            mask = *(undefined1 (*) [32])mask + mask_stride;
            h = h + -1;
          } while (h != 0);
        }
        else if (w == 8) {
          auVar15[8] = 0x40;
          auVar15._0_8_ = 0x4040404040404040;
          auVar15[9] = 0x40;
          auVar15[10] = 0x40;
          auVar15[0xb] = 0x40;
          auVar15[0xc] = 0x40;
          auVar15[0xd] = 0x40;
          auVar15[0xe] = 0x40;
          auVar15[0xf] = 0x40;
          auVar27._8_2_ = 0x200;
          auVar27._0_8_ = 0x200020002000200;
          auVar27._10_2_ = 0x200;
          auVar27._12_2_ = 0x200;
          auVar27._14_2_ = 0x200;
          do {
            auVar25 = vpshufb_avx(*(undefined1 (*) [16])mask,auVar43);
            auVar41._8_8_ = auVar25._0_8_;
            auVar41._0_8_ = auVar25._0_8_;
            auVar25 = vpshufd_avx(auVar25,0xee);
            auVar25 = vpavgb_avx(auVar41,auVar25);
            auVar49 = vpsubb_avx(auVar15,auVar25);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)src0;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)src1;
            auVar24 = vpunpcklbw_avx(auVar50,auVar54);
            auVar25 = vpunpcklbw_avx(auVar25,auVar49);
            auVar25 = vpmaddubsw_avx(auVar24,auVar25);
            auVar25 = vpmulhrsw_avx(auVar25,auVar27);
            auVar25 = vpackuswb_avx(auVar25,auVar25);
            *(long *)dst = auVar25._0_8_;
            dst = dst + dst_stride;
            src0 = (uint8_t *)((long)src0 + uVar1);
            src1 = (uint8_t *)((long)src1 + uVar2);
            mask = *(undefined1 (*) [16])mask + mask_stride;
            h = h + -1;
          } while (h != 0);
        }
        else {
          auVar13._16_16_ = _DAT_00513e40;
          auVar13._0_16_ = _DAT_00513e40;
          auVar26[8] = 0x40;
          auVar26._0_8_ = 0x4040404040404040;
          auVar26[9] = 0x40;
          auVar26[10] = 0x40;
          auVar26[0xb] = 0x40;
          auVar26[0xc] = 0x40;
          auVar26[0xd] = 0x40;
          auVar26[0xe] = 0x40;
          auVar26[0xf] = 0x40;
          auVar26[0x10] = 0x40;
          auVar26[0x11] = 0x40;
          auVar26[0x12] = 0x40;
          auVar26[0x13] = 0x40;
          auVar26[0x14] = 0x40;
          auVar26[0x15] = 0x40;
          auVar26[0x16] = 0x40;
          auVar26[0x17] = 0x40;
          auVar26[0x18] = 0x40;
          auVar26[0x19] = 0x40;
          auVar26[0x1a] = 0x40;
          auVar26[0x1b] = 0x40;
          auVar26[0x1c] = 0x40;
          auVar26[0x1d] = 0x40;
          auVar26[0x1e] = 0x40;
          auVar26[0x1f] = 0x40;
          do {
            if (0 < w) {
              lVar4 = 0;
              do {
                auVar47 = vpshufb_avx2(*(undefined1 (*) [32])(mask + lVar4 * 2),auVar13);
                auVar48 = vpshufb_avx2(*(undefined1 (*) [32])(mask + lVar4 * 2 + 0x20),auVar13);
                auVar33 = vpunpckhqdq_avx2(auVar47,auVar48);
                auVar47 = vpunpcklqdq_avx2(auVar47,auVar48);
                auVar47 = vpavgb_avx2(auVar47,auVar33);
                auVar32 = vpermq_avx2(auVar47,0xd8);
                auVar48 = vpsubb_avx2(auVar26,auVar32);
                auVar47 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                          *(undefined1 (*) [32])(src1 + lVar4));
                auVar33 = vpunpcklbw_avx2(auVar32,auVar48);
                auVar47 = vpmaddubsw_avx2(auVar47,auVar33);
                auVar33 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                          *(undefined1 (*) [32])(src1 + lVar4));
                auVar48 = vpunpckhbw_avx2(auVar32,auVar48);
                auVar48 = vpmaddubsw_avx2(auVar33,auVar48);
                auVar47 = vpsrlw_avx2(auVar47,5);
                auVar47 = vpavgw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                auVar48 = vpsrlw_avx2(auVar48,5);
                auVar48 = vpavgw_avx2(auVar48,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                auVar47 = vpackuswb_avx2(auVar47,auVar48);
                *(undefined1 (*) [32])(dst + lVar4) = auVar47;
                lVar4 = lVar4 + 0x20;
              } while (lVar4 < w);
            }
            dst = dst + dst_stride;
            src0 = src0 + uVar1;
            src1 = src1 + uVar2;
            mask = mask + mask_stride;
            h = h + -1;
          } while (h != 0);
        }
      }
    }
    else {
      uVar1 = (ulong)src0_stride;
      uVar3 = (ulong)src1_stride;
      uVar2 = (ulong)(mask_stride * 2);
      if (w == 4) {
        auVar17[8] = 0x7f;
        auVar17._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar17[9] = 0x7f;
        auVar17[10] = 0x7f;
        auVar17[0xb] = 0x7f;
        auVar17[0xc] = 0x7f;
        auVar17[0xd] = 0x7f;
        auVar17[0xe] = 0x7f;
        auVar17[0xf] = 0x7f;
        auVar35[8] = 0x40;
        auVar35._0_8_ = 0x4040404040404040;
        auVar35[9] = 0x40;
        auVar35[10] = 0x40;
        auVar35[0xb] = 0x40;
        auVar35[0xc] = 0x40;
        auVar35[0xd] = 0x40;
        auVar35[0xe] = 0x40;
        auVar35[0xf] = 0x40;
        auVar42._8_2_ = 0x200;
        auVar42._0_8_ = 0x200020002000200;
        auVar42._10_2_ = 0x200;
        auVar42._12_2_ = 0x200;
        auVar42._14_2_ = 0x200;
        do {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)mask;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *(ulong *)((long)mask + (ulong)mask_stride);
          auVar25 = vpaddb_avx(auVar55,auVar51);
          auVar49 = vpshufb_avx(auVar25,auVar43);
          auVar24 = vpshufd_avx(auVar49,0xee);
          auVar25 = vpand_avx(auVar49,auVar24);
          auVar49 = vpsrlw_avx(auVar49 ^ auVar24,1);
          auVar49 = vpand_avx(auVar49,auVar17);
          auVar25 = vpaddb_avx(auVar25,auVar49);
          auVar25 = vpmovzxbw_avx(auVar25);
          auVar25 = vpavgw_avx(auVar25,(undefined1  [16])0x0);
          auVar25 = vpackuswb_avx(auVar25,auVar25);
          auVar49 = vpsubb_avx(auVar35,auVar25);
          auVar24 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
          auVar25 = vpunpcklbw_avx(auVar25,auVar49);
          auVar25 = vpmaddubsw_avx(auVar24,auVar25);
          auVar25 = vpmulhrsw_avx(auVar25,auVar42);
          auVar25 = vpackuswb_avx(auVar25,auVar25);
          *(int *)dst = auVar25._0_4_;
          dst = dst + dst_stride;
          src0 = (uint8_t *)((long)src0 + uVar1);
          src1 = (uint8_t *)((long)src1 + uVar3);
          mask = (uint8_t *)((long)mask + uVar2);
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 0x10) {
        auVar11._8_2_ = 0xff;
        auVar11._0_8_ = 0xff00ff00ff00ff;
        auVar11._10_2_ = 0xff;
        auVar11._12_2_ = 0xff;
        auVar11._14_2_ = 0xff;
        auVar11._16_2_ = 0xff;
        auVar11._18_2_ = 0xff;
        auVar11._20_2_ = 0xff;
        auVar11._22_2_ = 0xff;
        auVar11._24_2_ = 0xff;
        auVar11._26_2_ = 0xff;
        auVar11._28_2_ = 0xff;
        auVar11._30_2_ = 0xff;
        auVar16[8] = 0x7f;
        auVar16._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar16[9] = 0x7f;
        auVar16[10] = 0x7f;
        auVar16[0xb] = 0x7f;
        auVar16[0xc] = 0x7f;
        auVar16[0xd] = 0x7f;
        auVar16[0xe] = 0x7f;
        auVar16[0xf] = 0x7f;
        auVar38[8] = 0x40;
        auVar38._0_8_ = 0x4040404040404040;
        auVar38[9] = 0x40;
        auVar38[10] = 0x40;
        auVar38[0xb] = 0x40;
        auVar38[0xc] = 0x40;
        auVar38[0xd] = 0x40;
        auVar38[0xe] = 0x40;
        auVar38[0xf] = 0x40;
        auVar38[0x10] = 0x40;
        auVar38[0x11] = 0x40;
        auVar38[0x12] = 0x40;
        auVar38[0x13] = 0x40;
        auVar38[0x14] = 0x40;
        auVar38[0x15] = 0x40;
        auVar38[0x16] = 0x40;
        auVar38[0x17] = 0x40;
        auVar38[0x18] = 0x40;
        auVar38[0x19] = 0x40;
        auVar38[0x1a] = 0x40;
        auVar38[0x1b] = 0x40;
        auVar38[0x1c] = 0x40;
        auVar38[0x1d] = 0x40;
        auVar38[0x1e] = 0x40;
        auVar38[0x1f] = 0x40;
        do {
          auVar47 = vpaddb_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])mask + mask_stride),
                                *(undefined1 (*) [32])mask);
          auVar48 = vpand_avx2(auVar47,auVar11);
          auVar43 = vpackuswb_avx(auVar48._0_16_,auVar48._16_16_);
          auVar47 = vpsrlw_avx2(auVar47,8);
          auVar25 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
          auVar49 = vpand_avx(auVar25,auVar43);
          auVar43 = vpsrlw_avx(auVar25 ^ auVar43,1);
          auVar43 = vpand_avx(auVar43,auVar16);
          auVar43 = vpaddb_avx(auVar49,auVar43);
          auVar47 = vpmovzxbw_avx2(auVar43);
          auVar47 = vpavgw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar47 = vpackuswb_avx2(auVar47,auVar47);
          auVar48 = vpsubb_avx2(auVar38,auVar47);
          auVar43 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar25 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar56._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar25;
          auVar56._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43;
          auVar47 = vpunpcklbw_avx2(auVar47,auVar48);
          auVar47 = vpmaddubsw_avx2(auVar56,auVar47);
          auVar47 = vpsrlw_avx2(auVar47,5);
          auVar47 = vpavgw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar43 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
          *(undefined1 (*) [16])dst = auVar43;
          dst = *(undefined1 (*) [16])dst + dst_stride;
          src0 = *(undefined1 (*) [16])src0 + uVar1;
          src1 = *(undefined1 (*) [16])src1 + uVar3;
          mask = *(undefined1 (*) [32])mask + uVar2;
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 8) {
        auVar14[8] = 0x7f;
        auVar14._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar14[9] = 0x7f;
        auVar14[10] = 0x7f;
        auVar14[0xb] = 0x7f;
        auVar14[0xc] = 0x7f;
        auVar14[0xd] = 0x7f;
        auVar14[0xe] = 0x7f;
        auVar14[0xf] = 0x7f;
        auVar34[8] = 0x40;
        auVar34._0_8_ = 0x4040404040404040;
        auVar34[9] = 0x40;
        auVar34[10] = 0x40;
        auVar34[0xb] = 0x40;
        auVar34[0xc] = 0x40;
        auVar34[0xd] = 0x40;
        auVar34[0xe] = 0x40;
        auVar34[0xf] = 0x40;
        auVar40._8_2_ = 0x200;
        auVar40._0_8_ = 0x200020002000200;
        auVar40._10_2_ = 0x200;
        auVar40._12_2_ = 0x200;
        auVar40._14_2_ = 0x200;
        do {
          auVar25 = vpaddb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride),
                               *(undefined1 (*) [16])mask);
          auVar49 = vpshufb_avx(auVar25,auVar43);
          auVar24 = vpshufd_avx(auVar49,0xee);
          auVar25 = vpand_avx(auVar49,auVar24);
          auVar49 = vpsrlw_avx(auVar49 ^ auVar24,1);
          auVar49 = vpand_avx(auVar49,auVar14);
          auVar25 = vpaddb_avx(auVar25,auVar49);
          auVar25 = vpmovzxbw_avx(auVar25);
          auVar25 = vpavgw_avx(auVar25,(undefined1  [16])0x0);
          auVar25 = vpackuswb_avx(auVar25,auVar25);
          auVar49 = vpsubb_avx(auVar34,auVar25);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)src0;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)src1;
          auVar24 = vpunpcklbw_avx(auVar57,auVar58);
          auVar25 = vpunpcklbw_avx(auVar25,auVar49);
          auVar25 = vpmaddubsw_avx(auVar24,auVar25);
          auVar25 = vpmulhrsw_avx(auVar25,auVar40);
          auVar25 = vpackuswb_avx(auVar25,auVar25);
          *(long *)dst = auVar25._0_8_;
          dst = dst + dst_stride;
          src0 = (uint8_t *)((long)src0 + uVar1);
          src1 = (uint8_t *)((long)src1 + uVar3);
          mask = *(undefined1 (*) [16])mask + uVar2;
          h = h + -1;
        } while (h != 0);
      }
      else {
        auVar12._8_2_ = 0xff;
        auVar12._0_8_ = 0xff00ff00ff00ff;
        auVar12._10_2_ = 0xff;
        auVar12._12_2_ = 0xff;
        auVar12._14_2_ = 0xff;
        auVar12._16_2_ = 0xff;
        auVar12._18_2_ = 0xff;
        auVar12._20_2_ = 0xff;
        auVar12._22_2_ = 0xff;
        auVar12._24_2_ = 0xff;
        auVar12._26_2_ = 0xff;
        auVar12._28_2_ = 0xff;
        auVar12._30_2_ = 0xff;
        auVar18[8] = 0x7f;
        auVar18._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar18[9] = 0x7f;
        auVar18[10] = 0x7f;
        auVar18[0xb] = 0x7f;
        auVar18[0xc] = 0x7f;
        auVar18[0xd] = 0x7f;
        auVar18[0xe] = 0x7f;
        auVar18[0xf] = 0x7f;
        puVar5 = mask + (ulong)mask_stride + 0x20;
        auVar39[8] = 0x40;
        auVar39._0_8_ = 0x4040404040404040;
        auVar39[9] = 0x40;
        auVar39[10] = 0x40;
        auVar39[0xb] = 0x40;
        auVar39[0xc] = 0x40;
        auVar39[0xd] = 0x40;
        auVar39[0xe] = 0x40;
        auVar39[0xf] = 0x40;
        auVar39[0x10] = 0x40;
        auVar39[0x11] = 0x40;
        auVar39[0x12] = 0x40;
        auVar39[0x13] = 0x40;
        auVar39[0x14] = 0x40;
        auVar39[0x15] = 0x40;
        auVar39[0x16] = 0x40;
        auVar39[0x17] = 0x40;
        auVar39[0x18] = 0x40;
        auVar39[0x19] = 0x40;
        auVar39[0x1a] = 0x40;
        auVar39[0x1b] = 0x40;
        auVar39[0x1c] = 0x40;
        auVar39[0x1d] = 0x40;
        auVar39[0x1e] = 0x40;
        auVar39[0x1f] = 0x40;
        do {
          if (0 < w) {
            lVar4 = 0;
            do {
              auVar47 = vpaddb_avx2(*(undefined1 (*) [32])(puVar5 + lVar4 * 2 + -0x20),
                                    *(undefined1 (*) [32])(mask + lVar4 * 2));
              auVar48 = vpaddb_avx2(*(undefined1 (*) [32])(puVar5 + lVar4 * 2),
                                    *(undefined1 (*) [32])(mask + lVar4 * 2 + 0x20));
              auVar33 = vpand_avx2(auVar47,auVar12);
              auVar43 = vpackuswb_avx(auVar33._0_16_,auVar33._16_16_);
              auVar47 = vpsrlw_avx2(auVar47,8);
              auVar25 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
              auVar49 = vpand_avx(auVar25,auVar43);
              auVar43 = vpsrlw_avx(auVar25 ^ auVar43,1);
              auVar43 = vpand_avx(auVar43,auVar18);
              auVar43 = vpaddb_avx(auVar49,auVar43);
              auVar47 = vpmovzxbw_avx2(auVar43);
              auVar31 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar33 = vpavgw_avx2(auVar47,auVar31);
              auVar47 = vpand_avx2(auVar48,auVar12);
              auVar43 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
              auVar47 = vpsrlw_avx2(auVar48,8);
              auVar25 = vpackuswb_avx(auVar47._0_16_,auVar47._16_16_);
              auVar49 = vpand_avx(auVar25,auVar43);
              auVar43 = vpsrlw_avx(auVar25 ^ auVar43,1);
              auVar43 = vpand_avx(auVar43,auVar18);
              auVar43 = vpaddb_avx(auVar49,auVar43);
              auVar47 = vpmovzxbw_avx2(auVar43);
              auVar47 = vpavgw_avx2(auVar47,auVar31);
              auVar47 = vpackuswb_avx2(auVar33,auVar47);
              auVar32 = vpermq_avx2(auVar47,0xd8);
              auVar48 = vpsubb_avx2(auVar39,auVar32);
              auVar47 = vpunpcklbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                        *(undefined1 (*) [32])(src1 + lVar4));
              auVar33 = vpunpcklbw_avx2(auVar32,auVar48);
              auVar47 = vpmaddubsw_avx2(auVar47,auVar33);
              auVar33 = vpunpckhbw_avx2(*(undefined1 (*) [32])(src0 + lVar4),
                                        *(undefined1 (*) [32])(src1 + lVar4));
              auVar48 = vpunpckhbw_avx2(auVar32,auVar48);
              auVar48 = vpmaddubsw_avx2(auVar33,auVar48);
              auVar47 = vpsrlw_avx2(auVar47,5);
              auVar47 = vpavgw_avx2(auVar47,auVar31);
              auVar48 = vpsrlw_avx2(auVar48,5);
              auVar48 = vpavgw_avx2(auVar48,auVar31);
              auVar47 = vpackuswb_avx2(auVar47,auVar48);
              *(undefined1 (*) [32])(dst + lVar4) = auVar47;
              lVar4 = lVar4 + 0x20;
            } while (lVar4 < w);
          }
          dst = dst + dst_stride;
          src0 = src0 + uVar1;
          src1 = src1 + uVar3;
          mask = mask + uVar2;
          puVar5 = puVar5 + uVar2;
          h = h + -1;
        } while (h != 0);
      }
    }
    return;
  }
  aom_blend_a64_mask_c
            (dst,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh);
  return;
}

Assistant:

void aom_blend_a64_mask_avx2(uint8_t *dst, uint32_t dst_stride,
                             const uint8_t *src0, uint32_t src0_stride,
                             const uint8_t *src1, uint32_t src1_stride,
                             const uint8_t *mask, uint32_t mask_stride, int w,
                             int h, int subw, int subh) {
  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (UNLIKELY((h | w) & 3)) {  // if (w <= 2 || h <= 2)
    aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                         mask, mask_stride, w, h, subw, subh);
  } else {
    if (subw & subh) {
      blend_a64_mask_sx_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                                src1_stride, mask, mask_stride, w, h);
    } else if (subw) {
      blend_a64_mask_sx_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else if (subh) {
      blend_a64_mask_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else {
      blend_a64_mask_avx2(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                          mask, mask_stride, w, h);
    }
  }
}